

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

ContextType
ChooseContextMode(BrotliEncoderParams *params,uint8_t *data,size_t pos,size_t mask,size_t length)

{
  int iVar1;
  size_t length_local;
  size_t mask_local;
  size_t pos_local;
  uint8_t *data_local;
  BrotliEncoderParams *params_local;
  
  if ((9 < params->quality) && (iVar1 = BrotliIsMostlyUTF8(data,pos,mask,length,0.75), iVar1 == 0))
  {
    return CONTEXT_SIGNED;
  }
  return CONTEXT_UTF8;
}

Assistant:

static ContextType ChooseContextMode(const BrotliEncoderParams* params,
    const uint8_t* data, const size_t pos, const size_t mask,
    const size_t length) {
  /* We only do the computation for the option of something else than
     CONTEXT_UTF8 for the highest qualities */
  if (params->quality >= MIN_QUALITY_FOR_HQ_BLOCK_SPLITTING &&
      !BrotliIsMostlyUTF8(data, pos, mask, length, kMinUTF8Ratio)) {
    return CONTEXT_SIGNED;
  }
  return CONTEXT_UTF8;
}